

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmpack.cpp
# Opt level: O1

wchar_t __thiscall CharFieldSourceString::getch(CharFieldSourceString *this)

{
  byte bVar1;
  byte *pbVar2;
  wchar_t wVar3;
  uint ch;
  
  if (this->len != 0) {
    wVar3 = utf8_ptr::s_getch((this->p).p_);
    pbVar2 = (byte *)(this->p).p_;
    bVar1 = *pbVar2;
    this->len = (size_t)(pbVar2 + (this->len -
                                  (long)(pbVar2 + (ulong)(((bVar1 >> 5 & 1) != 0) + 1 &
                                                         (uint)(bVar1 >> 7) * 3) + 1)));
    (this->p).p_ = (char *)(pbVar2 + (ulong)(((bVar1 >> 5 & 1) != 0) + 1 & (uint)(bVar1 >> 7) * 3) +
                                     1);
    return wVar3;
  }
  return L'\0';
}

Assistant:

virtual wchar_t getch()
    {
        if (len != 0)
        {
            wchar_t ch = p.getch();
            p.inc(&len);
            return ch;
        }
        else
            return 0;
    }